

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Benchmark.cpp
# Opt level: O2

unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_> __thiscall
anon_unknown.dwarf_266b9::create_dic(anon_unknown_dwarf_266b9 *this,string *dic_type)

{
  bool bVar1;
  undefined8 in_RAX;
  
  bVar1 = std::operator==(dic_type,"SGL");
  if (bVar1) {
    ddd::make_unique<ddd::DictionarySGL<false,false>>();
  }
  else {
    bVar1 = std::operator==(dic_type,"SGL_NL");
    if (bVar1) {
      ddd::make_unique<ddd::DictionarySGL<false,true>>();
    }
    else {
      bVar1 = std::operator==(dic_type,"SGL_BL");
      if (bVar1) {
        ddd::make_unique<ddd::DictionarySGL<true,false>>();
      }
      else {
        bVar1 = std::operator==(dic_type,"SGL_NL_BL");
        if (bVar1) {
          ddd::make_unique<ddd::DictionarySGL<true,true>>();
        }
        else {
          bVar1 = std::operator==(dic_type,"MLT");
          if (bVar1) {
            ddd::make_unique<ddd::DictionaryMLT<false,false>>();
          }
          else {
            bVar1 = std::operator==(dic_type,"MLT_NL");
            if (bVar1) {
              ddd::make_unique<ddd::DictionaryMLT<false,true>>();
            }
            else {
              bVar1 = std::operator==(dic_type,"MLT_BL");
              if (bVar1) {
                ddd::make_unique<ddd::DictionaryMLT<true,false>>();
              }
              else {
                bVar1 = std::operator==(dic_type,"MLT_NL_BL");
                if (!bVar1) {
                  *(undefined8 *)this = 0;
                  return (__uniq_ptr_data<ddd::Dictionary,_std::default_delete<ddd::Dictionary>,_true,_true>
                          )(__uniq_ptr_data<ddd::Dictionary,_std::default_delete<ddd::Dictionary>,_true,_true>
                            )this;
                }
                ddd::make_unique<ddd::DictionaryMLT<true,true>>();
              }
            }
          }
        }
      }
    }
  }
  *(undefined8 *)this = in_RAX;
  return (__uniq_ptr_data<ddd::Dictionary,_std::default_delete<ddd::Dictionary>,_true,_true>)
         (__uniq_ptr_data<ddd::Dictionary,_std::default_delete<ddd::Dictionary>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Dictionary> create_dic(const std::string dic_type) {
  if (dic_type == "SGL") {
    return make_unique<DictionarySGL<false, false>>();
  } else if (dic_type == "SGL_NL") {
    return make_unique<DictionarySGL<false, true>>();
  } else if (dic_type == "SGL_BL") {
    return make_unique<DictionarySGL<true, false>>();
  } else if (dic_type == "SGL_NL_BL") {
    return make_unique<DictionarySGL<true, true>>();
  } else if (dic_type == "MLT") {
    return make_unique<DictionaryMLT<false, false>>();
  } else if (dic_type == "MLT_NL") {
    return make_unique<DictionaryMLT<false, true>>();
  } else if (dic_type == "MLT_BL") {
    return make_unique<DictionaryMLT<true, false>>();
  } else if (dic_type == "MLT_NL_BL") {
    return make_unique<DictionaryMLT<true, true>>();
  }
  return nullptr;
}